

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *this_00;
  pointer pBVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  fpclass_type fVar7;
  int iVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  int32_t *piVar10;
  pointer pBVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  int32_t iVar15;
  long in_FS_OFFSET;
  byte bVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<200U,_int,_void> local_478;
  int *local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  cpp_dec_float<200U,_int,_void> local_3e8;
  int *local_360;
  cpp_dec_float<200U,_int,_void> local_358;
  cpp_dec_float<200U,_int,_void> local_2d8;
  cpp_dec_float<200U,_int,_void> local_258;
  double local_1d8;
  undefined8 uStack_1d0;
  undefined4 local_1c8;
  uint uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  cpp_dec_float<200U,_int,_void> local_1b8;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar16 = 0;
  local_358.fpclass = cpp_dec_float_finite;
  local_358.prec_elem = 0x1c;
  local_358.data._M_elems[0] = 0;
  local_358.data._M_elems[1] = 0;
  local_358.data._M_elems[2] = 0;
  local_358.data._M_elems[3] = 0;
  local_358.data._M_elems[4] = 0;
  local_358.data._M_elems[5] = 0;
  local_358.data._M_elems[6] = 0;
  local_358.data._M_elems[7] = 0;
  local_358.data._M_elems[8] = 0;
  local_358.data._M_elems[9] = 0;
  local_358.data._M_elems[10] = 0;
  local_358.data._M_elems[0xb] = 0;
  local_358.data._M_elems[0xc] = 0;
  local_358.data._M_elems[0xd] = 0;
  local_358.data._M_elems[0xe] = 0;
  local_358.data._M_elems[0xf] = 0;
  local_358.data._M_elems[0x10] = 0;
  local_358.data._M_elems[0x11] = 0;
  local_358.data._M_elems[0x12] = 0;
  local_358.data._M_elems[0x13] = 0;
  local_358.data._M_elems[0x14] = 0;
  local_358.data._M_elems[0x15] = 0;
  local_358.data._M_elems[0x16] = 0;
  local_358.data._M_elems[0x17] = 0;
  local_358.data._M_elems[0x18] = 0;
  local_358.data._M_elems[0x19] = 0;
  local_358.data._M_elems._104_5_ = 0;
  local_358.data._M_elems[0x1b]._1_3_ = 0;
  local_358.exp = 0;
  local_358.neg = false;
  local_3f8 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    piVar10 = &local_478.prec_elem;
    local_478.fpclass = cpp_dec_float_finite;
    local_478.prec_elem = 0x1c;
    local_478.data._M_elems[0] = 0;
    local_478.data._M_elems[1] = 0;
    local_478.data._M_elems[2] = 0;
    local_478.data._M_elems[3] = 0;
    local_478.data._M_elems[4] = 0;
    local_478.data._M_elems[5] = 0;
    local_478.data._M_elems[6] = 0;
    local_478.data._M_elems[7] = 0;
    local_478.data._M_elems[8] = 0;
    local_478.data._M_elems[9] = 0;
    local_478.data._M_elems[10] = 0;
    local_478.data._M_elems[0xb] = 0;
    local_478.data._M_elems[0xc] = 0;
    local_478.data._M_elems[0xd] = 0;
    local_478.data._M_elems[0xe] = 0;
    local_478.data._M_elems[0xf] = 0;
    local_478.data._M_elems[0x10] = 0;
    local_478.data._M_elems[0x11] = 0;
    local_478.data._M_elems[0x12] = 0;
    local_478.data._M_elems[0x13] = 0;
    local_478.data._M_elems[0x14] = 0;
    local_478.data._M_elems[0x15] = 0;
    local_478.data._M_elems[0x16] = 0;
    local_478.data._M_elems[0x17] = 0;
    local_478.data._M_elems[0x18] = 0;
    local_478.data._M_elems[0x19] = 0;
    local_478.data._M_elems._104_5_ = 0;
    local_478.data._M_elems[0x1b]._1_3_ = 0;
    local_478.exp = 0;
    local_478.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_478,*(double *)(in_FS_OFFSET + -8));
  }
  else {
    iVar8 = *minIdx;
    pBVar2 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar11 = pBVar2 + iVar8;
    pcVar9 = &local_478;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar9->data)._M_elems[0] = *(uint *)&(pBVar11->val).m_backend;
      pBVar11 = (pointer)((long)&(pBVar11->val).m_backend + 4);
      pcVar9 = (cpp_dec_float<200U,_int,_void> *)((pcVar9->data)._M_elems + 1);
    }
    piVar10 = (int32_t *)((long)&pBVar2[iVar8].val.m_backend + 0x7c);
    local_478.exp = piVar10[-3];
    local_478.neg = *(bool *)(piVar10 + -2);
    local_478.fpclass = piVar10[-1];
  }
  iVar15 = *piVar10;
  pcVar9 = &local_478;
  pcVar12 = &local_130;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
    pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar16 * -2 + 1) * 4);
  }
  local_130.prec_elem = iVar15;
  local_130.fpclass = local_478.fpclass;
  if (0 < nnz) {
    local_360 = idx + nnz;
    local_3f0 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).epsilon;
    local_1d8 = *(double *)(in_FS_OFFSET + -8);
    local_1c8 = SUB84(local_1d8,0);
    uStack_1d0 = 0;
    uStack_1c4 = (uint)((ulong)local_1d8 >> 0x20) ^ 0x80000000;
    uStack_1c0 = 0;
    uStack_1bc = 0x80000000;
    pnVar1 = &(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).fastDelta;
    this_00 = &this->breakpoints;
    local_130.exp = local_478.exp;
    local_130.neg = local_478.neg;
    do {
      iVar8 = *idx;
      pnVar13 = upd + iVar8;
      pcVar9 = &local_258;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar16 * -2 + 1) * 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
      }
      local_258.exp = upd[iVar8].m_backend.exp;
      local_258.neg = upd[iVar8].m_backend.neg;
      uVar3._0_4_ = upd[iVar8].m_backend.fpclass;
      uVar3._4_4_ = upd[iVar8].m_backend.prec_elem;
      pnVar13 = local_3f0;
      pcVar9 = &local_478;
      local_258._120_8_ = uVar3;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar9->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + (ulong)bVar16 * -8 + 4);
        pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
      }
      local_478.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_478.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      fVar7 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon.m_backend.fpclass;
      iVar15 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.prec_elem;
      local_478.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_478.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (fVar7 == cpp_dec_float_NaN || (fpclass_type)uVar3 == cpp_dec_float_NaN) {
LAB_005c7664:
        pnVar13 = local_3f0;
        pcVar9 = &local_478;
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          (pcVar9->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + (ulong)bVar16 * -8 + 4);
          pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
        }
        local_478.prec_elem = iVar15;
        local_478.fpclass = fVar7;
        if (local_478.data._M_elems[0] != 0 || fVar7 != cpp_dec_float_finite) {
          local_478.neg = (bool)(local_478.neg ^ 1);
        }
        if (((fVar7 != cpp_dec_float_NaN) && (local_258.fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_258,&local_478), iVar5 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar9 = &upp[iVar8].m_backend;
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 0x1c;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems[6] = 0;
          local_478.data._M_elems[7] = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.data._M_elems[10] = 0;
          local_478.data._M_elems[0xb] = 0;
          local_478.data._M_elems[0xc] = 0;
          local_478.data._M_elems[0xd] = 0;
          local_478.data._M_elems[0xe] = 0;
          local_478.data._M_elems[0xf] = 0;
          local_478.data._M_elems[0x10] = 0;
          local_478.data._M_elems[0x11] = 0;
          local_478.data._M_elems[0x12] = 0;
          local_478.data._M_elems[0x13] = 0;
          local_478.data._M_elems[0x14] = 0;
          local_478.data._M_elems[0x15] = 0;
          local_478.data._M_elems[0x16] = 0;
          local_478.data._M_elems[0x17] = 0;
          local_478.data._M_elems[0x18] = 0;
          local_478.data._M_elems[0x19] = 0;
          local_478.data._M_elems._104_5_ = 0;
          local_478.data._M_elems[0x1b]._1_3_ = 0;
          local_478.exp = 0;
          local_478.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_478,local_1d8);
          if (((pcVar9->fpclass != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN))
             && (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (pcVar9,&local_478), iVar5 < 0)) {
            local_3e8.fpclass = cpp_dec_float_finite;
            local_3e8.prec_elem = 0x1c;
            local_3e8.data._M_elems[0] = 0;
            local_3e8.data._M_elems[1] = 0;
            local_3e8.data._M_elems[2] = 0;
            local_3e8.data._M_elems[3] = 0;
            local_3e8.data._M_elems[4] = 0;
            local_3e8.data._M_elems[5] = 0;
            local_3e8.data._M_elems[6] = 0;
            local_3e8.data._M_elems[7] = 0;
            local_3e8.data._M_elems[8] = 0;
            local_3e8.data._M_elems[9] = 0;
            local_3e8.data._M_elems[10] = 0;
            local_3e8.data._M_elems[0xb] = 0;
            local_3e8.data._M_elems[0xc] = 0;
            local_3e8.data._M_elems[0xd] = 0;
            local_3e8.data._M_elems[0xe] = 0;
            local_3e8.data._M_elems[0xf] = 0;
            local_3e8.data._M_elems[0x10] = 0;
            local_3e8.data._M_elems[0x11] = 0;
            local_3e8.data._M_elems[0x12] = 0;
            local_3e8.data._M_elems[0x13] = 0;
            local_3e8.data._M_elems[0x14] = 0;
            local_3e8.data._M_elems[0x15] = 0;
            local_3e8.data._M_elems[0x16] = 0;
            local_3e8.data._M_elems[0x17] = 0;
            local_3e8.data._M_elems[0x18] = 0;
            local_3e8.data._M_elems[0x19] = 0;
            local_3e8.data._M_elems._104_5_ = 0;
            local_3e8.data._M_elems[0x1b]._1_3_ = 0;
            local_3e8.exp = 0;
            local_3e8.neg = false;
            if (&local_3e8 == &vec[iVar8].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_3e8,pcVar9);
              if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
                local_3e8.neg = (bool)(local_3e8.neg ^ 1);
                goto LAB_005c7b59;
              }
LAB_005c7b6d:
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_478,0,(type *)0x0);
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_3e8,&local_478);
              if (0 < iVar5) goto LAB_005c7b99;
              pcVar9 = &local_478;
              pnVar13 = pnVar1;
              pcVar12 = pcVar9;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar12->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
                pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar13 + (ulong)bVar16 * -8 + 4);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_478.exp =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.exp;
              bVar4 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).fastDelta.m_backend.neg;
              local_478.fpclass =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.fpclass;
              local_478.prec_elem =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.prec_elem;
              local_478.neg = (bool)bVar4;
              if (local_478.fpclass != cpp_dec_float_finite || local_478.data._M_elems[0] != 0)
              goto LAB_005c7c95;
            }
            else {
              if (&local_3e8 != pcVar9) {
                pcVar12 = pcVar9;
                pcVar14 = &local_3e8;
                for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                  (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar16 * -8 + 4);
                  pcVar14 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar14 + (ulong)bVar16 * -8 + 4);
                }
                local_3e8.exp = pcVar9->exp;
                local_3e8.neg = pcVar9->neg;
                local_3e8.fpclass = pcVar9->fpclass;
                local_3e8.prec_elem = pcVar9->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        (&local_3e8,&vec[iVar8].m_backend);
LAB_005c7b59:
              if (local_3e8.fpclass != cpp_dec_float_NaN) goto LAB_005c7b6d;
LAB_005c7b99:
              local_1b8.fpclass = cpp_dec_float_finite;
              local_1b8.prec_elem = 0x1c;
              local_1b8.data._M_elems[0] = 0;
              local_1b8.data._M_elems[1] = 0;
              local_1b8.data._M_elems[2] = 0;
              local_1b8.data._M_elems[3] = 0;
              local_1b8.data._M_elems[4] = 0;
              local_1b8.data._M_elems[5] = 0;
              local_1b8.data._M_elems[6] = 0;
              local_1b8.data._M_elems[7] = 0;
              local_1b8.data._M_elems[8] = 0;
              local_1b8.data._M_elems[9] = 0;
              local_1b8.data._M_elems[10] = 0;
              local_1b8.data._M_elems[0xb] = 0;
              local_1b8.data._M_elems[0xc] = 0;
              local_1b8.data._M_elems[0xd] = 0;
              local_1b8.data._M_elems[0xe] = 0;
              local_1b8.data._M_elems[0xf] = 0;
              local_1b8.data._M_elems[0x10] = 0;
              local_1b8.data._M_elems[0x11] = 0;
              local_1b8.data._M_elems[0x12] = 0;
              local_1b8.data._M_elems[0x13] = 0;
              local_1b8.data._M_elems[0x14] = 0;
              local_1b8.data._M_elems[0x15] = 0;
              local_1b8.data._M_elems[0x16] = 0;
              local_1b8.data._M_elems[0x17] = 0;
              local_1b8.data._M_elems[0x18] = 0;
              local_1b8.data._M_elems[0x19] = 0;
              local_1b8.data._M_elems._104_5_ = 0;
              local_1b8.data._M_elems[0x1b]._1_3_ = 0;
              local_1b8.exp = 0;
              local_1b8.neg = false;
              pcVar9 = &local_3e8;
              if (&local_1b8 != &pnVar1->m_backend) {
                pcVar12 = &local_1b8;
                for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                  (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
                  pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4)
                  ;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar16 * -8 + 4);
                }
                local_1b8.exp = local_3e8.exp;
                local_1b8.neg = local_3e8.neg;
                local_1b8.fpclass = local_3e8.fpclass;
                local_1b8.prec_elem = local_3e8.prec_elem;
                pcVar9 = &pnVar1->m_backend;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        (&local_1b8,pcVar9);
              pcVar9 = &local_b0;
              pcVar12 = &local_1b8;
              pcVar14 = pcVar9;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_b0.exp = local_1b8.exp;
              local_b0.neg = local_1b8.neg;
              local_b0.fpclass = local_1b8.fpclass;
              local_b0.prec_elem = local_1b8.prec_elem;
              bVar4 = local_1b8.neg;
              if (local_1b8.fpclass != cpp_dec_float_finite || local_b0.data._M_elems[0] != 0) {
LAB_005c7c95:
                pcVar9->neg = (bool)(bVar4 ^ 1);
              }
            }
            local_2d8.fpclass = cpp_dec_float_finite;
            local_2d8.prec_elem = 0x1c;
            local_2d8.data._M_elems[0] = 0;
            local_2d8.data._M_elems[1] = 0;
            local_2d8.data._M_elems[2] = 0;
            local_2d8.data._M_elems[3] = 0;
            local_2d8.data._M_elems[4] = 0;
            local_2d8.data._M_elems[5] = 0;
            local_2d8.data._M_elems[6] = 0;
            local_2d8.data._M_elems[7] = 0;
            local_2d8.data._M_elems[8] = 0;
            local_2d8.data._M_elems[9] = 0;
            local_2d8.data._M_elems[10] = 0;
            local_2d8.data._M_elems[0xb] = 0;
            local_2d8.data._M_elems[0xc] = 0;
            local_2d8.data._M_elems[0xd] = 0;
            local_2d8.data._M_elems[0xe] = 0;
            local_2d8.data._M_elems[0xf] = 0;
            local_2d8.data._M_elems[0x10] = 0;
            local_2d8.data._M_elems[0x11] = 0;
            local_2d8.data._M_elems[0x12] = 0;
            local_2d8.data._M_elems[0x13] = 0;
            local_2d8.data._M_elems[0x14] = 0;
            local_2d8.data._M_elems[0x15] = 0;
            local_2d8.data._M_elems[0x16] = 0;
            local_2d8.data._M_elems[0x17] = 0;
            local_2d8.data._M_elems[0x18] = 0;
            local_2d8.data._M_elems[0x19] = 0;
            local_2d8.data._M_elems._104_5_ = 0;
            local_2d8.data._M_elems[0x1b]._1_3_ = 0;
            local_2d8.exp = 0;
            local_2d8.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_2d8,pcVar9,&local_258);
            pcVar9 = &local_2d8;
            pcVar12 = &local_358;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4);
            }
            local_358.exp = local_2d8.exp;
            local_358.neg = local_2d8.neg;
            local_358.fpclass = local_2d8.fpclass;
            local_358.prec_elem = local_2d8.prec_elem;
            pBVar2 = (this_00->data).
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pBVar2[*nBp].idx = iVar8;
            iVar8 = *nBp;
            pBVar2[iVar8].src = src;
            pcVar9 = &local_358;
            pBVar11 = pBVar2 + iVar8;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              *(uint *)&(pBVar11->val).m_backend = (pcVar9->data)._M_elems[0];
              pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
              pBVar11 = (pointer)((long)pBVar11 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            *(int *)((long)&pBVar2[iVar8].val.m_backend + 0x70) = local_2d8.exp;
            *(bool *)((long)&pBVar2[iVar8].val.m_backend + 0x74) = local_2d8.neg;
            *(undefined8 *)((long)&pBVar2[iVar8].val.m_backend + 0x78) = local_2d8._120_8_;
            if ((local_2d8.fpclass == cpp_dec_float_NaN) || (local_130.fpclass == cpp_dec_float_NaN)
               ) {
              iVar8 = *nBp;
            }
            else {
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_358,&local_130);
              iVar8 = *nBp;
              if (iVar5 < 0) {
                pcVar9 = &local_358;
                pcVar12 = &local_130;
                for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                  (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
                  pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4)
                  ;
                  pcVar12 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar12 + (ulong)bVar16 * -8 + 4);
                }
                local_130.exp = local_358.exp;
                local_130.neg = local_358.neg;
                local_130.fpclass = local_358.fpclass;
                local_130.prec_elem = local_358.prec_elem;
                *local_3f8 = iVar8;
              }
            }
            *nBp = iVar8 + 1;
          }
        }
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_258,&local_478);
        if (iVar5 < 1) {
          local_478.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.exp;
          local_478.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.neg;
          fVar7 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.fpclass;
          iVar15 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.prec_elem;
          goto LAB_005c7664;
        }
        ::soplex::infinity::__tls_init();
        pcVar9 = &low[iVar8].m_backend;
        local_478.fpclass = cpp_dec_float_finite;
        local_478.prec_elem = 0x1c;
        local_478.data._M_elems[0] = 0;
        local_478.data._M_elems[1] = 0;
        local_478.data._M_elems[2] = 0;
        local_478.data._M_elems[3] = 0;
        local_478.data._M_elems[4] = 0;
        local_478.data._M_elems[5] = 0;
        local_478.data._M_elems[6] = 0;
        local_478.data._M_elems[7] = 0;
        local_478.data._M_elems[8] = 0;
        local_478.data._M_elems[9] = 0;
        local_478.data._M_elems[10] = 0;
        local_478.data._M_elems[0xb] = 0;
        local_478.data._M_elems[0xc] = 0;
        local_478.data._M_elems[0xd] = 0;
        local_478.data._M_elems[0xe] = 0;
        local_478.data._M_elems[0xf] = 0;
        local_478.data._M_elems[0x10] = 0;
        local_478.data._M_elems[0x11] = 0;
        local_478.data._M_elems[0x12] = 0;
        local_478.data._M_elems[0x13] = 0;
        local_478.data._M_elems[0x14] = 0;
        local_478.data._M_elems[0x15] = 0;
        local_478.data._M_elems[0x16] = 0;
        local_478.data._M_elems[0x17] = 0;
        local_478.data._M_elems[0x18] = 0;
        local_478.data._M_elems[0x19] = 0;
        local_478.data._M_elems._104_5_ = 0;
        local_478.data._M_elems[0x1b]._1_3_ = 0;
        local_478.exp = 0;
        local_478.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_478,(double)CONCAT44(uStack_1c4,local_1c8)
                  );
        if (((pcVar9->fpclass != cpp_dec_float_NaN) && (local_478.fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (pcVar9,&local_478), 0 < iVar5)) {
          local_3e8.fpclass = cpp_dec_float_finite;
          local_3e8.prec_elem = 0x1c;
          local_3e8.data._M_elems[0] = 0;
          local_3e8.data._M_elems[1] = 0;
          local_3e8.data._M_elems[2] = 0;
          local_3e8.data._M_elems[3] = 0;
          local_3e8.data._M_elems[4] = 0;
          local_3e8.data._M_elems[5] = 0;
          local_3e8.data._M_elems[6] = 0;
          local_3e8.data._M_elems[7] = 0;
          local_3e8.data._M_elems[8] = 0;
          local_3e8.data._M_elems[9] = 0;
          local_3e8.data._M_elems[10] = 0;
          local_3e8.data._M_elems[0xb] = 0;
          local_3e8.data._M_elems[0xc] = 0;
          local_3e8.data._M_elems[0xd] = 0;
          local_3e8.data._M_elems[0xe] = 0;
          local_3e8.data._M_elems[0xf] = 0;
          local_3e8.data._M_elems[0x10] = 0;
          local_3e8.data._M_elems[0x11] = 0;
          local_3e8.data._M_elems[0x12] = 0;
          local_3e8.data._M_elems[0x13] = 0;
          local_3e8.data._M_elems[0x14] = 0;
          local_3e8.data._M_elems[0x15] = 0;
          local_3e8.data._M_elems[0x16] = 0;
          local_3e8.data._M_elems[0x17] = 0;
          local_3e8.data._M_elems[0x18] = 0;
          local_3e8.data._M_elems[0x19] = 0;
          local_3e8.data._M_elems._104_5_ = 0;
          local_3e8.data._M_elems[0x1b]._1_3_ = 0;
          local_3e8.exp = 0;
          local_3e8.neg = false;
          if (&local_3e8 == &vec[iVar8].m_backend) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_3e8,pcVar9);
            if (local_3e8.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite) {
              local_3e8.neg = (bool)(local_3e8.neg ^ 1);
              goto LAB_005c786e;
            }
LAB_005c787d:
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_478,0,(type *)0x0);
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3e8,&local_478);
            pcVar9 = &pnVar1->m_backend;
            if (iVar5 < 0) goto LAB_005c78ab;
          }
          else {
            if (&local_3e8 != pcVar9) {
              pcVar12 = pcVar9;
              pcVar14 = &local_3e8;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar14->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4)
                ;
                pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_3e8.exp = pcVar9->exp;
              local_3e8.neg = pcVar9->neg;
              local_3e8.fpclass = pcVar9->fpclass;
              local_3e8.prec_elem = pcVar9->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (&local_3e8,&vec[iVar8].m_backend);
LAB_005c786e:
            if (local_3e8.fpclass != cpp_dec_float_NaN) goto LAB_005c787d;
LAB_005c78ab:
            local_478.fpclass = cpp_dec_float_finite;
            local_478.prec_elem = 0x1c;
            local_478.data._M_elems[0] = 0;
            local_478.data._M_elems[1] = 0;
            local_478.data._M_elems[2] = 0;
            local_478.data._M_elems[3] = 0;
            local_478.data._M_elems[4] = 0;
            local_478.data._M_elems[5] = 0;
            local_478.data._M_elems[6] = 0;
            local_478.data._M_elems[7] = 0;
            local_478.data._M_elems[8] = 0;
            local_478.data._M_elems[9] = 0;
            local_478.data._M_elems[10] = 0;
            local_478.data._M_elems[0xb] = 0;
            local_478.data._M_elems[0xc] = 0;
            local_478.data._M_elems[0xd] = 0;
            local_478.data._M_elems[0xe] = 0;
            local_478.data._M_elems[0xf] = 0;
            local_478.data._M_elems[0x10] = 0;
            local_478.data._M_elems[0x11] = 0;
            local_478.data._M_elems[0x12] = 0;
            local_478.data._M_elems[0x13] = 0;
            local_478.data._M_elems[0x14] = 0;
            local_478.data._M_elems[0x15] = 0;
            local_478.data._M_elems[0x16] = 0;
            local_478.data._M_elems[0x17] = 0;
            local_478.data._M_elems[0x18] = 0;
            local_478.data._M_elems[0x19] = 0;
            local_478.data._M_elems._104_5_ = 0;
            local_478.data._M_elems[0x1b]._1_3_ = 0;
            local_478.exp = 0;
            local_478.neg = false;
            pcVar9 = &local_478;
            if (pcVar9 != &pnVar1->m_backend) {
              pnVar13 = pnVar1;
              pcVar12 = pcVar9;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar12->data)._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
                pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar13 + (ulong)bVar16 * -8 + 4);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_478.exp =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.exp;
              local_478.neg =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.neg;
              local_478.fpclass =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.fpclass;
              local_478.prec_elem =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                      (pcVar9,&local_3e8);
          }
          local_2d8.fpclass = cpp_dec_float_finite;
          local_2d8.prec_elem = 0x1c;
          local_2d8.data._M_elems[0] = 0;
          local_2d8.data._M_elems[1] = 0;
          local_2d8.data._M_elems[2] = 0;
          local_2d8.data._M_elems[3] = 0;
          local_2d8.data._M_elems[4] = 0;
          local_2d8.data._M_elems[5] = 0;
          local_2d8.data._M_elems[6] = 0;
          local_2d8.data._M_elems[7] = 0;
          local_2d8.data._M_elems[8] = 0;
          local_2d8.data._M_elems[9] = 0;
          local_2d8.data._M_elems[10] = 0;
          local_2d8.data._M_elems[0xb] = 0;
          local_2d8.data._M_elems[0xc] = 0;
          local_2d8.data._M_elems[0xd] = 0;
          local_2d8.data._M_elems[0xe] = 0;
          local_2d8.data._M_elems[0xf] = 0;
          local_2d8.data._M_elems[0x10] = 0;
          local_2d8.data._M_elems[0x11] = 0;
          local_2d8.data._M_elems[0x12] = 0;
          local_2d8.data._M_elems[0x13] = 0;
          local_2d8.data._M_elems[0x14] = 0;
          local_2d8.data._M_elems[0x15] = 0;
          local_2d8.data._M_elems[0x16] = 0;
          local_2d8.data._M_elems[0x17] = 0;
          local_2d8.data._M_elems[0x18] = 0;
          local_2d8.data._M_elems[0x19] = 0;
          local_2d8.data._M_elems._104_5_ = 0;
          local_2d8.data._M_elems[0x1b]._1_3_ = 0;
          local_2d8.exp = 0;
          local_2d8.neg = false;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2d8,pcVar9,&local_258);
          pcVar9 = &local_2d8;
          pcVar12 = &local_358;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4);
          }
          local_358.exp = local_2d8.exp;
          local_358.neg = local_2d8.neg;
          local_358.fpclass = local_2d8.fpclass;
          local_358.prec_elem = local_2d8.prec_elem;
          pBVar2 = (this_00->data).
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar2[*nBp].idx = iVar8;
          iVar8 = *nBp;
          pBVar2[iVar8].src = src;
          pcVar9 = &local_358;
          pBVar11 = pBVar2 + iVar8;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            *(uint *)&(pBVar11->val).m_backend = (pcVar9->data)._M_elems[0];
            pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
            pBVar11 = (pointer)((long)pBVar11 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          *(int *)((long)&pBVar2[iVar8].val.m_backend + 0x70) = local_2d8.exp;
          *(bool *)((long)&pBVar2[iVar8].val.m_backend + 0x74) = local_2d8.neg;
          *(undefined8 *)((long)&pBVar2[iVar8].val.m_backend + 0x78) = local_2d8._120_8_;
          if ((local_2d8.fpclass == cpp_dec_float_NaN) || (local_130.fpclass == cpp_dec_float_NaN))
          {
            iVar8 = *nBp;
          }
          else {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_358,&local_130);
            iVar8 = *nBp;
            if (iVar5 < 0) {
              pcVar9 = &local_358;
              pcVar12 = &local_130;
              for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
                (pcVar12->data)._M_elems[0] = (pcVar9->data)._M_elems[0];
                pcVar9 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar9 + (ulong)bVar16 * -8 + 4);
                pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_130.exp = local_358.exp;
              local_130.neg = local_358.neg;
              local_130.fpclass = local_358.fpclass;
              local_130.prec_elem = local_358.prec_elem;
              *local_3f8 = iVar8;
            }
          }
          *nBp = iVar8 + 1;
        }
      }
      iVar8 = *nBp;
      iVar5 = (int)((ulong)((long)(this->breakpoints).data.
                                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->breakpoints).data.
                                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (SBORROW4(iVar8,iVar5 * -0xf0f0f0f) == iVar8 + iVar5 * 0xf0f0f0f < 0) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&this_00->data,(long)iVar8 * 2);
      }
      idx = idx + 1;
    } while (idx < local_360);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}